

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

uint __thiscall VolumeFile::getNodeByPath(VolumeFile *this,string *filePath,NodeKey *nodeKey)

{
  bool bVar1;
  uint32_t uVar2;
  value_type vVar3;
  uint uVar4;
  uint32_t uVar5;
  uchar *puVar6;
  NodeKey *key;
  ulong uVar7;
  size_type sVar8;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  VolumeFile *in_RDI;
  NodeBTree nodeBtree;
  uint entryIndex;
  EntryKey entryKey;
  EntryBTree entryBtree;
  StringKey extKey;
  size_type extLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extPart;
  uint extIndex;
  uint nameIndex;
  StringKey nameKey;
  size_type nameLength;
  size_type dotPos;
  value_type *part;
  uint entryTreeIndex;
  uint i;
  uint nodeIndex;
  StringBTree extBtree;
  StringBTree nameBtree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string normalizedFilePath;
  uint32_t in_stack_fffffffffffffe08;
  uint32_t in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  uint32_t in_stack_fffffffffffffe14;
  undefined4 uVar9;
  char *in_stack_fffffffffffffe18;
  StringKey *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  long local_198;
  undefined8 in_stack_fffffffffffffe78;
  token_compress_mode_type eCompress;
  is_any_ofF<char> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  EntryKey local_120 [2];
  undefined8 local_f8;
  string local_f0 [32];
  uint local_d0;
  uint local_cc;
  long local_b8;
  long local_b0;
  reference local_a8;
  uint32_t local_9c;
  uint local_98;
  uint32_t local_94;
  int local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_40 [32];
  undefined8 *local_20;
  uint local_4;
  
  eCompress = (token_compress_mode_type)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if (in_RDI->m_entryTreeCount == 0) {
    local_4 = 0xffffffff;
  }
  else {
    local_20 = in_RDX;
    (*in_RDI->_vptr_VolumeFile[5])(local_40,in_RDI,in_RSI);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x132b76);
    boost::algorithm::is_any_of<char[2]>
              ((char (*) [2])CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
              (in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80,eCompress);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF
              ((is_any_ofF<char> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe20);
    if (bVar1) {
      local_4 = 0xffffffff;
    }
    else {
      puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x132c3b);
      uVar2 = nameTreeOffset(in_RDI);
      advancePointer<unsigned_char>(puVar6,(ulong)uVar2);
      StringBTree::StringBTree
                ((StringBTree *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      key = (NodeKey *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x132ca6);
      uVar2 = extTreeOffset(in_RDI);
      advancePointer<unsigned_char>((uchar *)key,(ulong)uVar2);
      StringBTree::StringBTree
                ((StringBTree *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_94 = 0xffffffff;
      local_9c = 0;
      for (local_98 = 0; uVar7 = (ulong)local_98,
          sVar8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_58), uVar7 < sVar8; local_98 = local_98 + 1) {
        local_a8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_58,(ulong)local_98);
        local_198 = std::__cxx11::string::find_last_of((char)local_a8,0x2e);
        local_b0 = local_198;
        if (local_198 == -1) {
          local_198 = std::__cxx11::string::size();
        }
        local_b8 = local_198;
        std::__cxx11::string::c_str();
        StringKey::StringKey
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
        local_cc = BTree<StringBTree,_StringKey>::searchByKey
                             ((BTree<StringBTree,_StringKey> *)
                              CONCAT44(uVar2,in_stack_fffffffffffffe88),(StringKey *)key);
        if (local_cc == 0xffffffff) break;
        local_d0 = 0;
        if (local_b0 != -1) {
          std::__cxx11::string::substr((ulong)local_f0,(ulong)local_a8);
          local_f8 = std::__cxx11::string::size();
          std::__cxx11::string::c_str();
          StringKey::StringKey
                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
          local_d0 = BTree<StringBTree,_StringKey>::searchByKey
                               ((BTree<StringBTree,_StringKey> *)
                                CONCAT44(uVar2,in_stack_fffffffffffffe88),(StringKey *)key);
          if (local_d0 == 0xffffffff) {
            local_80 = 2;
          }
          else {
            local_80 = 0;
          }
          std::__cxx11::string::~string(local_f0);
          if (local_80 != 0) break;
        }
        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x132f2f);
        vVar3 = entryTreeOffset((VolumeFile *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                in_stack_fffffffffffffe0c);
        advancePointer<unsigned_char>(puVar6,(ulong)vVar3);
        EntryBTree::EntryBTree
                  ((EntryBTree *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        EntryKey::EntryKey((EntryKey *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                           ,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
        uVar4 = BTree<EntryBTree,_EntryKey>::searchByKey
                          ((BTree<EntryBTree,_EntryKey> *)CONCAT44(uVar2,in_stack_fffffffffffffe88),
                           (EntryKey *)key);
        if (uVar4 == 0xffffffff) break;
        bVar1 = EntryKey::isDirectory(local_120);
        if (!bVar1) {
          local_94 = EntryKey::linkIndex(local_120);
          break;
        }
        local_9c = EntryKey::linkIndex(local_120);
      }
      if (local_94 == 0xffffffff) {
        local_4 = 0xffffffff;
      }
      else {
        in_stack_fffffffffffffe20 =
             (StringKey *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133078);
        uVar5 = nodeTreeOffset(in_RDI);
        puVar6 = advancePointer<unsigned_char>((uchar *)in_stack_fffffffffffffe20,(ulong)uVar5);
        bVar1 = hasMultipleVolumes((VolumeFile *)0x1330b6);
        uVar9 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe14);
        NodeBTree::NodeBTree((NodeBTree *)in_stack_fffffffffffffe20,puVar6,bVar1);
        NodeKey::NodeKey((NodeKey *)CONCAT44(uVar9,in_stack_fffffffffffffe10),
                         in_stack_fffffffffffffe0c);
        local_20[2] = local_140;
        *local_20 = local_150;
        local_20[1] = uStack_148;
        local_94 = BTree<NodeBTree,_NodeKey>::searchByKey
                             ((BTree<NodeBTree,_NodeKey> *)CONCAT44(uVar2,in_stack_fffffffffffffe88)
                              ,key);
        local_4 = local_94;
        if (local_94 == 0xffffffff) {
          local_4 = 0xffffffff;
        }
      }
    }
    local_80 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_40);
  }
  return local_4;
}

Assistant:

unsigned int VolumeFile::getNodeByPath(const std::string& filePath, NodeKey& nodeKey) const
{
	if (m_entryTreeCount == 0) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const auto normalizedFilePath = normalizeFilePath(filePath);
	std::vector<std::string> parts;
	boost::algorithm::split(
		parts,
		normalizedFilePath,
		boost::algorithm::is_any_of("/"),
		boost::algorithm::token_compress_on
	);

	if (parts.empty()) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const StringBTree nameBtree(
		advancePointer(m_data.data(), nameTreeOffset())
	);
	const StringBTree extBtree(
		advancePointer(m_data.data(), extTreeOffset())
	);

	auto nodeIndex = NodeBTree::INVALID_INDEX;
	for (auto i = 0u, entryTreeIndex = 0u; i < parts.size(); ++i) {
		const auto& part = parts[i];
		const auto dotPos = part.find_last_of('.');
		
		const auto nameLength = (dotPos != std::string::npos) ? dotPos : part.size();
		StringKey nameKey(part.c_str(), static_cast<uint32_t>(nameLength));
		const auto nameIndex = nameBtree.searchByKey(nameKey);
		if (nameIndex == StringBTree::INVALID_INDEX) {
			break;
		}
		
		auto extIndex = 0u;
		if (dotPos != std::string::npos) {
			const auto extPart = part.substr(dotPos);
			const auto extLength = extPart.size();
			StringKey extKey(extPart.c_str(), static_cast<uint32_t>(extLength));
			extIndex = extBtree.searchByKey(extKey);
			if (extIndex == StringBTree::INVALID_INDEX) {
				break;
			}
		}
		
		const EntryBTree entryBtree(
			advancePointer(m_data.data(), entryTreeOffset(entryTreeIndex))
		);
		EntryKey entryKey(nameIndex, extIndex);
		const auto entryIndex = entryBtree.searchByKey(entryKey);
		if (entryIndex == EntryBTree::INVALID_INDEX) {
			break;
		}
		
		if (entryKey.isDirectory()) {
			entryTreeIndex = entryKey.linkIndex();
		} else {
			nodeIndex = entryKey.linkIndex();
			break;
		}
	}
	if (nodeIndex == NodeBTree::INVALID_INDEX) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const NodeBTree nodeBtree(
		advancePointer(m_data.data(), nodeTreeOffset()),
		hasMultipleVolumes()
	);
	nodeKey = NodeKey(nodeIndex);
	nodeIndex = nodeBtree.searchByKey(nodeKey);
	if (nodeIndex == NodeBTree::INVALID_INDEX) {
		return NodeBTree::INVALID_INDEX;
	}
	
	return nodeIndex;
}